

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  bool bVar1;
  __shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  reference an_expectation_base;
  shared_ptr<testing::internal::ExpectationBase> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Expectation EVar4;
  allocator local_59;
  string local_58;
  __normal_iterator<std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
  local_38;
  __normal_iterator<std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
  local_30;
  __normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
  local_28;
  const_iterator it;
  ExpectationBase *exp_local;
  UntypedFunctionMockerBase *this_local;
  
  it._M_current = in_RDX;
  local_30._M_current =
       (shared_ptr<testing::internal::ExpectationBase> *)
       std::
       vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
       ::begin((vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                *)((long)&(exp->source_text_).field_2 + 8));
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<testing::internal::ExpectationBase>const*,std::vector<std::shared_ptr<testing::internal::ExpectationBase>,std::allocator<std::shared_ptr<testing::internal::ExpectationBase>>>>
  ::__normal_iterator<std::shared_ptr<testing::internal::ExpectationBase>*>
            ((__normal_iterator<std::shared_ptr<testing::internal::ExpectationBase>const*,std::vector<std::shared_ptr<testing::internal::ExpectationBase>,std::allocator<std::shared_ptr<testing::internal::ExpectationBase>>>>
              *)&local_28,&local_30);
  do {
    local_38._M_current =
         (shared_ptr<testing::internal::ExpectationBase> *)
         std::
         vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
         ::end((vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                *)((long)&(exp->source_text_).field_2 + 8));
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,"Cannot find expectation.",&local_59);
      Assert(false,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/3rdparty/googletest/googlemock/src/gmock-spec-builders.cc"
             ,0x204,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      Expectation::Expectation((Expectation *)this);
      _Var3._M_pi = extraout_RDX_00;
LAB_0015f353:
      EVar4.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = _Var3._M_pi;
      EVar4.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Expectation)
             EVar4.expectation_base_.
             super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
    }
    this_00 = &__gnu_cxx::
               __normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
               ::operator->(&local_28)->
               super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
    peVar2 = std::__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>::get
                       (this_00);
    if (peVar2 == (element_type *)it._M_current) {
      an_expectation_base =
           __gnu_cxx::
           __normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
           ::operator*(&local_28);
      Expectation::Expectation((Expectation *)this,an_expectation_base);
      _Var3._M_pi = extraout_RDX;
      goto LAB_0015f353;
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}